

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_bary2(REF_GEOM ref_geom,REF_INT *nodes,REF_DBL t,REF_DBL *bary)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  REF_INT sens;
  REF_DBL t1;
  REF_DBL t0;
  REF_INT local_4c;
  double local_48;
  double local_40;
  REF_DBL local_38;
  
  local_38 = t;
  uVar1 = ref_geom_cell_tuv(ref_geom,*nodes,nodes,1,&local_40,&local_4c);
  if (uVar1 == 0) {
    uVar1 = ref_geom_cell_tuv(ref_geom,nodes[1],nodes,1,&local_48,&local_4c);
    if (uVar1 == 0) {
      local_48 = local_48 - local_38;
      *bary = local_48;
      local_40 = local_38 - local_40;
      bary[1] = local_40;
      dVar2 = local_48 + local_40;
      dVar4 = dVar2 * 1e+20;
      if (dVar4 <= -dVar4) {
        dVar4 = -dVar4;
      }
      dVar3 = local_48;
      if (local_48 <= -local_48) {
        dVar3 = -local_48;
      }
      if (dVar3 < dVar4) {
        dVar3 = local_40;
        if (local_40 <= -local_40) {
          dVar3 = -local_40;
        }
        if (dVar3 < dVar4) {
          *bary = local_48 / dVar2;
          bary[1] = local_40 / dVar2;
          return 0;
        }
      }
      printf("%s: %d: %s: div zero total %.18e norms %.18e %.18e\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xf89,
             "ref_geom_bary2");
      *bary = 0.0;
      bary[1] = 0.0;
      uVar1 = 4;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xf7b,
             "ref_geom_bary2",(ulong)uVar1,"uv1");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xf79,
           "ref_geom_bary2",(ulong)uVar1,"uv0");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_geom_bary2(REF_GEOM ref_geom, REF_INT *nodes, REF_DBL t,
                                  REF_DBL *bary) {
  REF_DBL t0, t1;
  REF_INT sens;
  REF_DBL total;
  RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_EDGE, &t0, &sens),
      "uv0");
  RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_EDGE, &t1, &sens),
      "uv1");

  bary[0] = t1 - t;
  bary[1] = t - t0;

  total = bary[0] + bary[1];

  if (ref_math_divisible(bary[0], total) &&
      ref_math_divisible(bary[1], total)) {
    bary[0] /= total;
    bary[1] /= total;
  } else {
    REF_INT i;
    printf("%s: %d: %s: div zero total %.18e norms %.18e %.18e\n", __FILE__,
           __LINE__, __func__, total, bary[0], bary[1]);
    for (i = 0; i < 2; i++) bary[i] = 0.0;
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}